

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_4_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  unkbyte10 Var24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  ulong *puVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined4 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 *in_RCX;
  __m128i *palVar38;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  int in_ESI;
  __m128i *d0_00;
  long in_RDI;
  __m128i *x0_00;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  ulong uVar42;
  __m128i b;
  __m128i a;
  __m128i a_00;
  __m128i alVar43;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  __m128i v_05;
  __m128i v_06;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i t;
  __m128i thresh1;
  __m128i thresh0;
  __m128i l;
  __m128i limit;
  __m128i blimit;
  __m128i zero;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i p1;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i abs_p1q1p0q0;
  __m128i flat;
  __m128i zero_1;
  __m128i hev;
  __m128i mask;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i ff;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  ulong local_bd8;
  ulong uStack_bd0;
  byte local_bc8;
  undefined1 uStack_bc7;
  undefined1 uStack_bc6;
  undefined1 uStack_bc5;
  undefined1 uStack_bc4;
  undefined1 uStack_bc3;
  undefined1 uStack_bc2;
  undefined1 uStack_bc1;
  byte bStack_bc0;
  undefined1 uStack_bbf;
  undefined1 uStack_bbe;
  undefined1 uStack_bbd;
  undefined1 uStack_bbc;
  undefined1 uStack_bbb;
  undefined1 uStack_bba;
  undefined1 uStack_bb9;
  byte local_bb8;
  undefined1 uStack_bb7;
  undefined1 uStack_bb6;
  undefined1 uStack_bb5;
  undefined1 uStack_bb4;
  undefined1 uStack_bb3;
  undefined1 uStack_bb2;
  undefined1 uStack_bb1;
  byte bStack_bb0;
  undefined1 uStack_baf;
  undefined1 uStack_bae;
  undefined1 uStack_bad;
  undefined1 uStack_bac;
  undefined1 uStack_bab;
  undefined1 uStack_baa;
  undefined1 uStack_ba9;
  undefined1 local_ba8 [16];
  undefined4 local_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 local_b88;
  undefined4 uStack_b84;
  undefined4 uStack_b80;
  undefined4 uStack_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  ulong local_b68;
  longlong lStack_b60;
  ulong local_b58;
  longlong lStack_b50;
  longlong local_b48 [2];
  longlong local_b38 [2];
  longlong local_b28 [2];
  longlong local_b18 [2];
  longlong local_b08 [2];
  longlong local_af8 [2];
  longlong local_ae8 [2];
  longlong local_ad8 [2];
  longlong local_ac8 [3];
  undefined8 uStack_ab0;
  longlong local_aa8 [3];
  undefined8 uStack_a90;
  longlong local_a88 [3];
  undefined8 uStack_a70;
  longlong local_a68 [3];
  undefined8 uStack_a50;
  ulong local_a48 [2];
  longlong local_a38;
  undefined4 uStack_a34;
  longlong lStack_a30;
  undefined8 local_a28;
  undefined8 local_a18;
  int local_9e4;
  long local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  longlong local_988;
  undefined8 uStack_980;
  longlong *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  longlong local_948;
  undefined8 uStack_940;
  longlong *local_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 *local_910;
  longlong local_908;
  undefined8 uStack_900;
  longlong *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 *local_8d0;
  longlong local_8c8;
  undefined8 uStack_8c0;
  longlong *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  ulong local_738;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined8 local_728;
  ulong uStack_720;
  ulong *local_6f8;
  ulong *local_6f0;
  ulong *local_6e8;
  undefined1 (*local_6e0) [16];
  __m128i *local_6d8;
  __m128i *local_6d0;
  __m128i *local_6c8;
  __m128i *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  ulong local_558;
  ulong uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  byte bStack_510;
  undefined1 uStack_50f;
  undefined1 uStack_50e;
  undefined1 uStack_50d;
  undefined1 uStack_50c;
  undefined1 uStack_50b;
  undefined1 uStack_50a;
  undefined1 uStack_509;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined1 local_488;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  undefined1 uStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  undefined1 uStack_480;
  undefined1 uStack_47f;
  undefined1 uStack_47e;
  undefined1 uStack_47d;
  undefined1 uStack_47c;
  undefined1 uStack_47b;
  undefined1 uStack_47a;
  undefined1 uStack_479;
  undefined8 local_478;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  ulong uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong *local_3f8;
  ulong *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  ulong *local_3d8;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  ulong local_388;
  ulong uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  undefined8 uStack_360;
  ulong local_358;
  undefined8 uStack_350;
  undefined1 local_339;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  undefined8 uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  ulong uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  ulong uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_b78 = 0;
  uStack_b70 = 0;
  uVar1 = *in_RDX;
  uStack_990 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_9a0 = in_R9[1];
  local_998._0_4_ = (undefined4)uVar1;
  local_998._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_9a8._0_4_ = (undefined4)uVar2;
  local_9a8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_b88 = (undefined4)local_998;
  uStack_b84 = (undefined4)local_9a8;
  uStack_b80 = local_998._4_4_;
  uStack_b7c = local_9a8._4_4_;
  uVar3 = *in_RCX;
  uStack_9b0 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_9c0 = in_stack_00000008[1];
  local_9b8._0_4_ = (undefined4)uVar3;
  local_9b8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_9c8._0_4_ = (undefined4)uVar4;
  local_9c8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_b98 = (undefined4)local_9b8;
  uStack_b94 = (undefined4)local_9c8;
  uStack_b90 = local_9b8._4_4_;
  uStack_b8c = local_9c8._4_4_;
  local_ba8._4_4_ = (undefined4)local_9a8;
  local_ba8._0_4_ = (undefined4)local_998;
  uStack_7b0 = CONCAT44(local_9a8._4_4_,local_998._4_4_);
  local_ba8._12_4_ = (undefined4)local_9c8;
  local_ba8._8_4_ = (undefined4)local_9b8;
  uStack_7c0 = CONCAT44(local_9c8._4_4_,local_9b8._4_4_);
  local_868 = *in_R8;
  uStack_860 = 0;
  uStack_810 = 0;
  local_828 = 0;
  uStack_820 = 0;
  local_818._0_1_ = (byte)local_868;
  local_818._1_1_ = (undefined1)((ulong)local_868 >> 8);
  local_818._2_1_ = (undefined1)((ulong)local_868 >> 0x10);
  local_818._3_1_ = (undefined1)((ulong)local_868 >> 0x18);
  local_818._4_1_ = (byte)((ulong)local_868 >> 0x20);
  local_818._5_1_ = (undefined1)((ulong)local_868 >> 0x28);
  local_818._6_1_ = (undefined1)((ulong)local_868 >> 0x30);
  local_818._7_1_ = (undefined1)((ulong)local_868 >> 0x38);
  local_bb8 = (byte)local_818;
  uStack_bb7 = 0;
  uStack_bb6 = local_818._1_1_;
  uStack_bb5 = 0;
  uStack_bb4 = local_818._2_1_;
  uStack_bb3 = 0;
  uStack_bb2 = local_818._3_1_;
  uStack_bb1 = 0;
  bStack_bb0 = local_818._4_1_;
  uStack_baf = 0;
  uStack_bae = local_818._5_1_;
  uStack_bad = 0;
  uStack_bac = local_818._6_1_;
  uStack_bab = 0;
  uStack_baa = local_818._7_1_;
  uStack_ba9 = 0;
  local_888 = *in_stack_00000010;
  uStack_880 = 0;
  uStack_830 = 0;
  local_848 = 0;
  uStack_840 = 0;
  local_838._0_1_ = (byte)local_888;
  local_838._1_1_ = (undefined1)((ulong)local_888 >> 8);
  local_838._2_1_ = (undefined1)((ulong)local_888 >> 0x10);
  local_838._3_1_ = (undefined1)((ulong)local_888 >> 0x18);
  local_838._4_1_ = (byte)((ulong)local_888 >> 0x20);
  local_838._5_1_ = (undefined1)((ulong)local_888 >> 0x28);
  local_838._6_1_ = (undefined1)((ulong)local_888 >> 0x30);
  local_838._7_1_ = (undefined1)((ulong)local_888 >> 0x38);
  local_bc8 = (byte)local_838;
  uStack_bc7 = 0;
  uStack_bc6 = local_838._1_1_;
  uStack_bc5 = 0;
  uStack_bc4 = local_838._2_1_;
  uStack_bc3 = 0;
  uStack_bc2 = local_838._3_1_;
  uStack_bc1 = 0;
  bStack_bc0 = local_838._4_1_;
  uStack_bbf = 0;
  uStack_bbe = local_838._5_1_;
  uStack_bbd = 0;
  uStack_bbc = local_838._6_1_;
  uStack_bbb = 0;
  uStack_bba = local_838._7_1_;
  uStack_bb9 = 0;
  local_bd8 = (ulong)CONCAT16(local_818._3_1_,
                              (uint6)CONCAT14(local_818._2_1_,
                                              (uint)CONCAT12(local_818._1_1_,(ushort)(byte)local_818
                                                            )));
  uStack_7d0 = (ulong)CONCAT16(local_818._7_1_,
                               (uint6)CONCAT14(local_818._6_1_,
                                               (uint)CONCAT12(local_818._5_1_,
                                                              (ushort)local_818._4_1_)));
  uStack_bd0 = (ulong)CONCAT16(local_838._3_1_,
                               (uint6)CONCAT14(local_838._2_1_,
                                               (uint)CONCAT12(local_838._1_1_,
                                                              (ushort)(byte)local_838)));
  uStack_7e0 = (ulong)CONCAT16(local_838._7_1_,
                               (uint6)CONCAT14(local_838._6_1_,
                                               (uint)CONCAT12(local_838._5_1_,
                                                              (ushort)local_838._4_1_)));
  local_890 = (undefined8 *)(in_RDI + -2);
  local_a68[2] = *local_890;
  uStack_8a0 = 0;
  uStack_a50 = 0;
  local_8b0 = (longlong *)(in_RDI + -2 + (long)in_ESI);
  local_a68[0] = *local_8b0;
  uStack_8c0 = 0;
  local_a68[1] = 0;
  local_8d0 = (undefined8 *)(in_RDI + -2 + (long)(in_ESI * 2));
  local_a88[2] = *local_8d0;
  uStack_8e0 = 0;
  uStack_a70 = 0;
  local_8f0 = (longlong *)(in_RDI + -2 + (long)(in_ESI * 3));
  local_a88[0] = *local_8f0;
  uStack_900 = 0;
  local_a88[1] = 0;
  local_910 = (undefined8 *)(in_RDI + -2 + (long)(in_ESI << 2));
  local_aa8[2] = *local_910;
  uStack_920 = 0;
  uStack_a90 = 0;
  local_930 = (longlong *)(in_RDI + -2 + (long)(in_ESI * 5));
  local_aa8[0] = *local_930;
  uStack_940 = 0;
  local_aa8[1] = 0;
  local_950 = (undefined8 *)(in_RDI + -2 + (long)(in_ESI * 6));
  local_ac8[2] = *local_950;
  uStack_960 = 0;
  uStack_ab0 = 0;
  local_970 = (longlong *)(in_RDI + -2 + (long)(in_ESI * 7));
  local_ac8[0] = *local_970;
  uStack_980 = 0;
  local_ac8[1] = 0;
  palVar38 = (__m128i *)&local_a28;
  d0_00 = (__m128i *)local_a48;
  x0_00 = (__m128i *)(local_a68 + 2);
  local_9e4 = in_ESI;
  local_9e0 = in_RDI;
  local_9c8 = uVar4;
  local_9b8 = uVar3;
  local_9a8 = uVar2;
  local_998 = uVar1;
  local_988 = local_ac8[0];
  local_968 = local_ac8[2];
  local_948 = local_aa8[0];
  local_928 = local_aa8[2];
  local_908 = local_a88[0];
  local_8e8 = local_a88[2];
  local_8c8 = local_a68[0];
  local_8a8 = local_a68[2];
  local_838 = local_888;
  local_818 = local_868;
  local_7e8 = uStack_bd0;
  local_7d8 = local_bd8;
  local_7c8 = local_ba8._8_8_;
  local_7b8 = local_ba8._0_8_;
  transpose8x8_low_sse2
            (x0_00,(__m128i *)local_a68,(__m128i *)(local_a88 + 2),(__m128i *)local_a88,
             (__m128i *)(local_aa8 + 2),(__m128i *)local_aa8,(__m128i *)(local_ac8 + 2),
             (__m128i *)local_ac8,d0_00,(__m128i *)&local_a18,palVar38,
             (__m128i *)&stack0xfffffffffffff5c8);
  alVar43[1] = (longlong)palVar38;
  alVar43[0] = (longlong)&local_a18;
  local_6e0 = &local_ba8;
  local_6e8 = &local_bd8;
  local_6f0 = &local_b58;
  local_6f8 = &local_b68;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_788 = 0;
  uStack_780 = 0;
  uStack_720 = local_a48[0];
  uStack_48c = local_a28._4_4_;
  local_488 = (undefined1)local_a48[0];
  uStack_487 = (undefined1)(local_a48[0] >> 8);
  uStack_486 = (undefined1)(local_a48[0] >> 0x10);
  uStack_485 = (undefined1)(local_a48[0] >> 0x18);
  uStack_49c = uStack_a34;
  _local_498 = CONCAT44(local_a18._4_4_,local_6f8._0_4_);
  uStack_730 = uStack_490;
  uStack_72c = local_a28._4_4_;
  local_728 = CONCAT44(uStack_a34,uStack_4a0);
  a[1] = (longlong)d0_00;
  a[0] = (longlong)x0_00;
  local_6d8 = (__m128i *)&stack0xfffffffffffff5c8;
  local_6d0 = palVar38;
  local_6c8 = (__m128i *)&local_a18;
  local_6c0 = d0_00;
  alVar43 = abs_diff(a,alVar43);
  b[0] = alVar43[1];
  b[1] = (longlong)palVar38;
  a_00[1] = (longlong)d0_00;
  a_00[0] = (longlong)x0_00;
  local_798 = extraout_XMM0_Qa;
  uStack_790 = extraout_XMM0_Qb;
  abs_diff(a_00,b);
  puVar27 = local_6f0;
  local_5d8 = local_798;
  uVar28 = local_5d8;
  uStack_5d0 = uStack_790;
  uVar29 = uStack_5d0;
  local_5e8 = uStack_790;
  uStack_5e0 = 0;
  local_5d8._0_1_ = (byte)local_798;
  local_5d8._1_1_ = (byte)((ulong)local_798 >> 8);
  local_5d8._2_1_ = (byte)((ulong)local_798 >> 0x10);
  local_5d8._3_1_ = (byte)((ulong)local_798 >> 0x18);
  local_5d8._4_1_ = (byte)((ulong)local_798 >> 0x20);
  local_5d8._5_1_ = (byte)((ulong)local_798 >> 0x28);
  local_5d8._6_1_ = (byte)((ulong)local_798 >> 0x30);
  local_5d8._7_1_ = (byte)((ulong)local_798 >> 0x38);
  uStack_5d0._0_1_ = (byte)uStack_790;
  uStack_5d0._1_1_ = (byte)((ulong)uStack_790 >> 8);
  uStack_5d0._2_1_ = (byte)((ulong)uStack_790 >> 0x10);
  uStack_5d0._3_1_ = (byte)((ulong)uStack_790 >> 0x18);
  uStack_5d0._4_1_ = (byte)((ulong)uStack_790 >> 0x20);
  uStack_5d0._5_1_ = (byte)((ulong)uStack_790 >> 0x28);
  uStack_5d0._6_1_ = (byte)((ulong)uStack_790 >> 0x30);
  uStack_5d0._7_1_ = (byte)((ulong)uStack_790 >> 0x38);
  local_778[0] = ((byte)local_5d8 < (byte)uStack_5d0) * (byte)uStack_5d0 |
                 ((byte)local_5d8 >= (byte)uStack_5d0) * (byte)local_5d8;
  local_778[2] = (local_5d8._1_1_ < uStack_5d0._1_1_) * uStack_5d0._1_1_ |
                 (local_5d8._1_1_ >= uStack_5d0._1_1_) * local_5d8._1_1_;
  local_778[4] = (local_5d8._2_1_ < uStack_5d0._2_1_) * uStack_5d0._2_1_ |
                 (local_5d8._2_1_ >= uStack_5d0._2_1_) * local_5d8._2_1_;
  local_778[6] = (local_5d8._3_1_ < uStack_5d0._3_1_) * uStack_5d0._3_1_ |
                 (local_5d8._3_1_ >= uStack_5d0._3_1_) * local_5d8._3_1_;
  local_778[8] = (local_5d8._4_1_ < uStack_5d0._4_1_) * uStack_5d0._4_1_ |
                 (local_5d8._4_1_ >= uStack_5d0._4_1_) * local_5d8._4_1_;
  local_778[10] =
       (local_5d8._5_1_ < uStack_5d0._5_1_) * uStack_5d0._5_1_ |
       (local_5d8._5_1_ >= uStack_5d0._5_1_) * local_5d8._5_1_;
  local_778[0xc] =
       (local_5d8._6_1_ < uStack_5d0._6_1_) * uStack_5d0._6_1_ |
       (local_5d8._6_1_ >= uStack_5d0._6_1_) * local_5d8._6_1_;
  local_778[0xe] =
       (local_5d8._7_1_ < uStack_5d0._7_1_) * uStack_5d0._7_1_ |
       (local_5d8._7_1_ >= uStack_5d0._7_1_) * local_5d8._7_1_;
  local_798 = CONCAT17(local_778[0xe],
                       CONCAT16(local_778[0xc],
                                CONCAT15(local_778[10],
                                         CONCAT14(local_778[8],
                                                  CONCAT13(local_778[6],
                                                           CONCAT12(local_778[4],
                                                                    CONCAT11(local_778[2],
                                                                             local_778[0])))))));
  local_698 = local_798;
  uStack_690 = uStack_790;
  local_6a8 = local_788;
  uVar1 = local_6a8;
  uStack_6a0 = uStack_780;
  local_6a8._0_1_ = (char)local_788;
  local_6a8._1_1_ = (char)((ulong)local_788 >> 8);
  local_6a8._2_1_ = (char)((ulong)local_788 >> 0x10);
  local_6a8._3_1_ = (char)((ulong)local_788 >> 0x18);
  local_6a8._4_1_ = (char)((ulong)local_788 >> 0x20);
  local_6a8._5_1_ = (char)((ulong)local_788 >> 0x28);
  local_6a8._6_1_ = (char)((ulong)local_788 >> 0x30);
  local_6a8._7_1_ = (char)((ulong)local_788 >> 0x38);
  local_778[1] = (char)local_6a8;
  local_778[3] = local_6a8._1_1_;
  local_778[5] = local_6a8._2_1_;
  local_778[7] = local_6a8._3_1_;
  local_778[9] = local_6a8._4_1_;
  Var24 = local_778._0_10_;
  local_778[0xb] = local_6a8._5_1_;
  auVar25 = local_778._0_12_;
  local_778[0xd] = local_6a8._6_1_;
  auVar26 = local_778._0_14_;
  local_778[0xf] = local_6a8._7_1_;
  uVar42 = *local_6e8;
  uVar5 = local_6e8[1];
  local_4f8 = local_778._0_8_;
  uVar32 = local_4f8;
  uStack_4f0 = local_778._8_8_;
  uVar33 = uStack_4f0;
  local_4f8._2_2_ = SUB42(local_778._0_4_,2);
  local_4f8._4_2_ = SUB62(local_778._0_6_,4);
  local_4f8._6_2_ = SUB82(local_778._0_8_,6);
  uStack_4f0._0_2_ = SUB102(Var24,8);
  uStack_4f0._2_2_ = auVar25._10_2_;
  uStack_4f0._4_2_ = auVar26._12_2_;
  uStack_4f0._6_2_ = local_778._14_2_;
  local_508._0_2_ = (short)uVar42;
  local_508._2_2_ = (short)(uVar42 >> 0x10);
  local_508._4_2_ = (short)(uVar42 >> 0x20);
  local_508._6_2_ = (short)(uVar42 >> 0x30);
  uStack_500._0_2_ = (short)uVar5;
  uStack_500._2_2_ = (short)(uVar5 >> 0x10);
  uStack_500._4_2_ = (short)(uVar5 >> 0x20);
  uStack_500._6_2_ = (short)(uVar5 >> 0x30);
  local_778._2_2_ = -(ushort)(local_508._2_2_ < local_4f8._2_2_);
  local_778._0_2_ = -(ushort)((short)local_508 < (short)local_778._0_2_);
  local_778._4_2_ = -(ushort)(local_508._4_2_ < local_4f8._4_2_);
  local_778._6_2_ = -(ushort)(local_508._6_2_ < local_4f8._6_2_);
  local_778._8_2_ = -(ushort)((short)uStack_500 < (short)uStack_4f0);
  local_778._10_2_ = -(ushort)(uStack_500._2_2_ < uStack_4f0._2_2_);
  local_778._12_2_ = -(ushort)(uStack_500._4_2_ < uStack_4f0._4_2_);
  local_778._14_2_ = -(ushort)(uStack_500._6_2_ < uStack_4f0._6_2_);
  local_4b8 = local_778._0_8_;
  uStack_4b0 = local_778._8_8_;
  local_4c8 = local_778._0_8_;
  uStack_4c0 = local_778._8_8_;
  auVar10._8_8_ = local_778._8_8_;
  auVar10._0_8_ = local_778._0_8_;
  auVar9._8_8_ = local_778._8_8_;
  auVar9._0_8_ = local_778._0_8_;
  local_778 = packsswb(auVar10,auVar9);
  auVar40._8_8_ = extraout_XMM0_Qb_00;
  auVar40._0_8_ = extraout_XMM0_Qa_00;
  auVar39._8_8_ = extraout_XMM0_Qb_00;
  auVar39._0_8_ = extraout_XMM0_Qa_00;
  local_748 = paddusb(auVar40,auVar39);
  bStack_510 = (byte)extraout_XMM0_Qb_00;
  uStack_50f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
  uStack_50e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  uStack_50d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
  uStack_50c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_50b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
  uStack_50a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  uStack_509 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
  local_758[1] = bStack_510;
  local_758[0] = bStack_510;
  local_758[2] = uStack_50f;
  local_758[3] = uStack_50f;
  local_758[4] = uStack_50e;
  local_758[5] = uStack_50e;
  local_758[6] = uStack_50d;
  local_758[7] = uStack_50d;
  local_758[8] = uStack_50c;
  local_758[9] = uStack_50c;
  Var24 = local_758._0_10_;
  local_758[10] = uStack_50b;
  local_758[0xb] = uStack_50b;
  auVar25 = local_758._0_12_;
  local_758[0xc] = uStack_50a;
  local_758[0xd] = uStack_50a;
  auVar26 = local_758._0_14_;
  local_758[0xe] = uStack_509;
  local_758[0xf] = uStack_509;
  local_578 = local_758._0_8_;
  uVar30 = local_578;
  uStack_570 = local_758._8_8_;
  uVar31 = uStack_570;
  local_57c = 9;
  local_578._2_2_ = SUB42(local_758._0_4_,2);
  local_578._4_2_ = SUB62(local_758._0_6_,4);
  local_578._6_2_ = SUB82(local_758._0_8_,6);
  uStack_570._0_2_ = SUB102(Var24,8);
  uStack_570._2_2_ = auVar25._10_2_;
  uStack_570._4_2_ = auVar26._12_2_;
  uStack_570._6_2_ = local_758._14_2_;
  local_758[1] = 0;
  local_758[0] = bStack_510 >> 1;
  local_758._2_2_ = local_578._2_2_ >> 9;
  local_758._4_2_ = local_578._4_2_ >> 9;
  local_758._6_2_ = local_578._6_2_ >> 9;
  local_758._8_2_ = (ushort)uStack_570 >> 9;
  local_758._10_2_ = uStack_570._2_2_ >> 9;
  local_758._12_2_ = uStack_570._4_2_ >> 9;
  local_758._14_2_ = uStack_570._6_2_ >> 9;
  local_4d8 = local_758._0_8_;
  uStack_4d0 = local_758._8_8_;
  local_4e8 = local_758._0_8_;
  uStack_4e0 = local_758._8_8_;
  auVar8._8_8_ = local_758._8_8_;
  auVar8._0_8_ = local_758._0_8_;
  auVar7._8_8_ = local_758._8_8_;
  auVar7._0_8_ = local_758._0_8_;
  local_758 = packsswb(auVar8,auVar7);
  local_5b8 = local_748._0_8_;
  uStack_5b0 = local_748._8_8_;
  local_5c8 = local_758._0_8_;
  uStack_5c0 = local_758._8_8_;
  auVar39 = paddusb(local_748,local_758);
  local_768._0_8_ = auVar39._0_8_;
  local_768._8_8_ = auVar39._8_8_;
  local_678 = local_768._0_8_;
  uStack_670 = local_768._8_8_;
  local_688 = local_798;
  uStack_680 = uStack_790;
  local_548 = *(undefined8 *)*local_6e0;
  uStack_540 = *(undefined8 *)(*local_6e0 + 8);
  local_538 = local_768._0_8_;
  uStack_530 = local_798;
  auVar6._8_8_ = local_798;
  auVar6._0_8_ = local_768._0_8_;
  auVar39 = psubusb(auVar6,*local_6e0);
  local_768._0_8_ = auVar39._0_8_;
  local_768._8_8_ = auVar39._8_8_;
  local_5f8 = local_768._0_8_;
  uVar3 = local_5f8;
  uStack_5f0 = local_768._8_8_;
  uVar4 = uStack_5f0;
  local_608 = local_788;
  uStack_600 = uStack_780;
  uVar2 = uStack_600;
  local_5f8._0_1_ = auVar39[0];
  local_5f8._1_1_ = auVar39[1];
  local_5f8._2_1_ = auVar39[2];
  local_5f8._3_1_ = auVar39[3];
  local_5f8._4_1_ = auVar39[4];
  local_5f8._5_1_ = auVar39[5];
  local_5f8._6_1_ = auVar39[6];
  local_5f8._7_1_ = auVar39[7];
  uStack_5f0._0_1_ = auVar39[8];
  uStack_5f0._1_1_ = auVar39[9];
  uStack_5f0._2_1_ = auVar39[10];
  uStack_5f0._3_1_ = auVar39[0xb];
  uStack_5f0._4_1_ = auVar39[0xc];
  uStack_5f0._5_1_ = auVar39[0xd];
  uStack_5f0._6_1_ = auVar39[0xe];
  uStack_5f0._7_1_ = auVar39[0xf];
  uStack_600._0_1_ = (char)uStack_780;
  uStack_600._1_1_ = (char)((ulong)uStack_780 >> 8);
  uStack_600._2_1_ = (char)((ulong)uStack_780 >> 0x10);
  uStack_600._3_1_ = (char)((ulong)uStack_780 >> 0x18);
  uStack_600._4_1_ = (char)((ulong)uStack_780 >> 0x20);
  uStack_600._5_1_ = (char)((ulong)uStack_780 >> 0x28);
  uStack_600._6_1_ = (char)((ulong)uStack_780 >> 0x30);
  uStack_600._7_1_ = (char)((ulong)uStack_780 >> 0x38);
  local_768[1] = -(local_5f8._1_1_ == local_6a8._1_1_);
  local_768[0] = -((char)local_5f8 == (char)local_6a8);
  local_768[2] = -(local_5f8._2_1_ == local_6a8._2_1_);
  local_768[3] = -(local_5f8._3_1_ == local_6a8._3_1_);
  local_768[4] = -(local_5f8._4_1_ == local_6a8._4_1_);
  local_768[5] = -(local_5f8._5_1_ == local_6a8._5_1_);
  local_768[6] = -(local_5f8._6_1_ == local_6a8._6_1_);
  local_768[7] = -(local_5f8._7_1_ == local_6a8._7_1_);
  local_768[8] = -((char)uStack_5f0 == (char)uStack_600);
  local_768[9] = -(uStack_5f0._1_1_ == uStack_600._1_1_);
  local_768[10] = -(uStack_5f0._2_1_ == uStack_600._2_1_);
  local_768[0xb] = -(uStack_5f0._3_1_ == uStack_600._3_1_);
  local_768[0xc] = -(uStack_5f0._4_1_ == uStack_600._4_1_);
  local_768[0xd] = -(uStack_5f0._5_1_ == uStack_600._5_1_);
  local_768[0xe] = -(uStack_5f0._6_1_ == uStack_600._6_1_);
  local_768[0xf] = -(uStack_5f0._7_1_ == uStack_600._7_1_);
  local_558 = local_768._0_8_;
  uStack_550 = local_768._8_8_;
  local_568 = local_768._8_8_;
  uStack_560 = 0;
  local_318 = local_768._0_8_ & local_768._8_8_;
  local_768._8_8_ = 0;
  local_768._0_8_ = local_318;
  local_3d0 = &local_728;
  local_3d8 = &local_738;
  local_3e0 = local_778;
  local_3e8 = local_768;
  local_3f0 = local_6f0;
  local_3f8 = local_6f8;
  local_8d = 3;
  local_8e = 3;
  local_8f = 3;
  local_90 = 3;
  local_91 = 3;
  local_92 = 3;
  local_93 = 3;
  local_94 = 3;
  local_95 = 4;
  local_96 = 4;
  local_97 = 4;
  local_98 = 4;
  local_99 = 4;
  local_9a = 4;
  local_9b = 4;
  local_9c = 4;
  local_408 = 0x404040404040404;
  uStack_400 = 0x303030303030303;
  local_339 = 0x80;
  local_b9 = 0x80;
  local_ba = 0x80;
  local_bb = 0x80;
  local_bc = 0x80;
  local_bd = 0x80;
  local_be = 0x80;
  local_bf = 0x80;
  local_c0 = 0x80;
  local_c1 = 0x80;
  local_c2 = 0x80;
  local_c3 = 0x80;
  local_c4 = 0x80;
  local_c5 = 0x80;
  local_c6 = 0x80;
  local_c7 = 0x80;
  local_c8 = 0x80;
  local_418 = 0x8080808080808080;
  uStack_410 = 0x8080808080808080;
  local_488 = 0xff;
  uStack_487 = 0xff;
  uStack_486 = 0xff;
  uStack_485 = 0xff;
  uStack_484 = 0xff;
  uStack_483 = 0xff;
  uStack_482 = 0xff;
  uStack_481 = 0xff;
  uStack_480 = 0xff;
  uStack_47f = 0xff;
  uStack_47e = 0xff;
  uStack_47d = 0xff;
  uStack_47c = 0xff;
  uStack_47b = 0xff;
  uStack_47a = 0xff;
  uStack_479 = 0xff;
  local_268 = local_728;
  local_1a8 = local_728 ^ 0x8080808080808080;
  uStack_1a0 = uStack_720 ^ 0x8080808080808080;
  uStack_280 = CONCAT44(uStack_72c,uStack_730);
  local_1b8 = local_738 ^ 0x8080808080808080;
  uStack_240 = uStack_280 ^ 0x8080808080808080;
  auVar16._8_8_ = uStack_1a0;
  auVar16._0_8_ = local_1a8;
  auVar15._8_8_ = uStack_240;
  auVar15._0_8_ = local_1b8;
  local_448 = psubsb(auVar16,auVar15);
  local_2f8 = local_778._0_8_;
  uStack_2f0 = local_778._8_8_;
  local_2e8 = local_448._8_8_;
  uStack_2e0 = 0;
  local_1c8 = local_448._8_8_ & local_778._0_8_;
  uStack_1c0 = 0;
  local_1d8 = local_448._0_8_;
  uStack_1d0 = local_448._8_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_1c8;
  auVar39 = psubsb(auVar14,local_448);
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  local_1e8 = local_428;
  uStack_1e0 = uStack_420;
  local_1f8 = local_448._0_8_;
  uStack_1f0 = local_448._8_8_;
  auVar39 = psubsb(auVar39,local_448);
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  local_208 = local_428;
  uStack_200 = uStack_420;
  local_218 = local_448._0_8_;
  uStack_210 = local_448._8_8_;
  auVar39 = psubsb(auVar39,local_448);
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  uStack_310 = 0;
  local_308 = local_428;
  uStack_300 = uStack_420;
  local_368 = local_428 & local_318;
  uStack_360 = 0;
  auVar20._8_8_ = local_368;
  auVar20._0_8_ = local_368;
  auVar19._8_8_ = 0x303030303030303;
  auVar19._0_8_ = 0x404040404040404;
  auVar39 = paddsb(auVar20,auVar19);
  local_438 = auVar39._0_8_;
  uStack_430 = auVar39._8_8_;
  local_128 = local_438;
  uStack_120 = uStack_430;
  uVar37 = uStack_120;
  local_138 = local_438;
  uStack_130 = uStack_430;
  uStack_120._0_1_ = auVar39[8];
  uStack_120._1_1_ = auVar39[9];
  uStack_120._2_1_ = auVar39[10];
  uStack_120._3_1_ = auVar39[0xb];
  uStack_120._4_1_ = auVar39[0xc];
  uStack_120._5_1_ = auVar39[0xd];
  uStack_120._6_1_ = auVar39[0xe];
  uStack_120._7_1_ = auVar39[0xf];
  local_428._0_2_ = CONCAT11((undefined1)uStack_120,(undefined1)uStack_120);
  local_428._0_3_ = CONCAT12(uStack_120._1_1_,(undefined2)local_428);
  local_428._0_4_ = CONCAT13(uStack_120._1_1_,(undefined3)local_428);
  local_428._0_5_ = CONCAT14(uStack_120._2_1_,(undefined4)local_428);
  local_428._0_6_ = CONCAT15(uStack_120._2_1_,(undefined5)local_428);
  local_428._0_7_ = CONCAT16(uStack_120._3_1_,(undefined6)local_428);
  local_428 = CONCAT17(uStack_120._3_1_,(undefined7)local_428);
  uStack_420._0_1_ = uStack_120._4_1_;
  uStack_420._1_1_ = uStack_120._4_1_;
  uStack_420._2_1_ = uStack_120._5_1_;
  uStack_420._3_1_ = uStack_120._5_1_;
  uStack_420._4_1_ = uStack_120._6_1_;
  uStack_420._5_1_ = uStack_120._6_1_;
  uStack_420._6_1_ = uStack_120._7_1_;
  uStack_420._7_1_ = uStack_120._7_1_;
  local_398 = local_438;
  uVar36 = local_398;
  uStack_390 = uStack_430;
  local_3a8 = local_438;
  uStack_3a0 = uStack_430;
  local_398._0_1_ = auVar39[0];
  local_398._1_1_ = auVar39[1];
  local_398._2_1_ = auVar39[2];
  local_398._3_1_ = auVar39[3];
  local_398._4_1_ = auVar39[4];
  local_398._5_1_ = auVar39[5];
  local_398._6_1_ = auVar39[6];
  local_398._7_1_ = auVar39[7];
  local_438._0_2_ = CONCAT11((undefined1)local_398,(undefined1)local_398);
  local_438._0_3_ = CONCAT12(local_398._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(local_398._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(local_398._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(local_398._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(local_398._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(local_398._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = local_398._4_1_;
  uStack_430._1_1_ = local_398._4_1_;
  uStack_430._2_1_ = local_398._5_1_;
  uStack_430._3_1_ = local_398._5_1_;
  uStack_430._4_1_ = local_398._6_1_;
  uStack_430._5_1_ = local_398._6_1_;
  uStack_430._6_1_ = local_398._7_1_;
  uStack_430._7_1_ = local_398._7_1_;
  local_48 = local_438;
  uStack_40 = uStack_430;
  local_4c = 0xb;
  auVar23._8_8_ = uStack_430;
  auVar23._0_8_ = local_438;
  auVar39 = psraw(auVar23,ZEXT416(0xb));
  local_68 = local_428;
  uStack_60 = uStack_420;
  local_6c = 0xb;
  auVar22._8_8_ = uStack_420;
  auVar22._0_8_ = local_428;
  auVar40 = psraw(auVar22,ZEXT416(0xb));
  local_438 = auVar39._0_8_;
  uStack_430 = auVar39._8_8_;
  local_428 = auVar40._0_8_;
  uStack_420 = auVar40._8_8_;
  local_e8 = local_438;
  uStack_e0 = uStack_430;
  local_f8 = local_428;
  uStack_f0 = uStack_420;
  auVar40 = packsswb(auVar39,auVar40);
  local_438 = auVar40._0_8_;
  uStack_430 = auVar40._8_8_;
  uStack_370 = uStack_430;
  local_238 = 0xffffffffffffffff;
  uStack_230 = 0xffffffffffffffff;
  local_228 = local_438;
  uStack_220 = uStack_430;
  auVar13._8_8_ = 0xffffffffffffffff;
  auVar13._0_8_ = 0xffffffffffffffff;
  auVar39 = psubsb(auVar40,auVar13);
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  local_3b8 = local_428;
  uVar35 = local_3b8;
  uStack_3b0 = uStack_420;
  local_3c8 = local_428;
  uStack_3c0 = uStack_420;
  local_3b8._0_1_ = auVar39[0];
  local_3b8._1_1_ = auVar39[1];
  local_3b8._2_1_ = auVar39[2];
  local_3b8._3_1_ = auVar39[3];
  local_3b8._4_1_ = auVar39[4];
  local_3b8._5_1_ = auVar39[5];
  local_3b8._6_1_ = auVar39[6];
  local_3b8._7_1_ = auVar39[7];
  local_428._0_2_ = CONCAT11((undefined1)local_3b8,(undefined1)local_3b8);
  local_428._0_3_ = CONCAT12(local_3b8._1_1_,(undefined2)local_428);
  local_428._0_4_ = CONCAT13(local_3b8._1_1_,(undefined3)local_428);
  local_428._0_5_ = CONCAT14(local_3b8._2_1_,(undefined4)local_428);
  local_428._0_6_ = CONCAT15(local_3b8._2_1_,(undefined5)local_428);
  local_428._0_7_ = CONCAT16(local_3b8._3_1_,(undefined6)local_428);
  local_428 = CONCAT17(local_3b8._3_1_,(undefined7)local_428);
  uStack_420._0_1_ = local_3b8._4_1_;
  uStack_420._1_1_ = local_3b8._4_1_;
  uStack_420._2_1_ = local_3b8._5_1_;
  uStack_420._3_1_ = local_3b8._5_1_;
  uStack_420._4_1_ = local_3b8._6_1_;
  uStack_420._5_1_ = local_3b8._6_1_;
  uStack_420._6_1_ = local_3b8._7_1_;
  uStack_420._7_1_ = local_3b8._7_1_;
  local_88 = local_428;
  uStack_80 = uStack_420;
  local_8c = 9;
  auVar21._8_8_ = uStack_420;
  auVar21._0_8_ = local_428;
  auVar39 = psraw(auVar21,ZEXT416(9));
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  local_108 = local_428;
  uStack_100 = uStack_420;
  local_118 = local_428;
  uStack_110 = uStack_420;
  auVar39 = packsswb(auVar39,auVar39);
  local_148 = local_778._0_8_;
  uStack_140 = local_778._8_8_;
  local_428 = auVar39._0_8_;
  uStack_420 = auVar39._8_8_;
  local_158 = local_428;
  uStack_150 = uStack_420;
  local_388 = ~local_778._0_8_ & local_428;
  uStack_380 = ~local_778._8_8_ & uStack_420;
  uStack_420 = uStack_380;
  local_428 = local_388;
  auVar39 = _local_428;
  uStack_430._4_4_ = auVar40._12_4_;
  uVar34 = uStack_430._4_4_;
  uStack_420._4_4_ = (undefined4)(uStack_380 >> 0x20);
  uStack_1c = uStack_430._4_4_;
  uStack_2c = uStack_420._4_4_;
  _local_28 = CONCAT44(auVar40._4_4_,0x80808080);
  uStack_470 = uStack_20;
  uStack_46c = uStack_430._4_4_;
  local_468._4_4_ = uStack_420._4_4_;
  local_468._0_4_ = uStack_30;
  local_378 = local_438;
  uStack_430 = local_388;
  local_248 = local_468._0_8_;
  local_258 = local_438;
  auVar12._8_8_ = uStack_240;
  auVar12._0_8_ = local_468._0_8_;
  auVar11._8_8_ = local_388;
  auVar11._0_8_ = local_438;
  local_468 = psubsb(auVar12,auVar11);
  uStack_190 = CONCAT44(uVar34,uStack_20);
  local_198 = local_478;
  auVar18._8_8_ = uStack_1a0;
  auVar18._0_8_ = local_1a8;
  auVar17._8_8_ = uStack_190;
  auVar17._0_8_ = local_478;
  local_458 = paddsb(auVar18,auVar17);
  local_2a8 = local_468._0_8_;
  uStack_2a0 = local_468._8_8_;
  uVar41 = local_468._8_8_ ^ 0x8080808080808080;
  local_6a8 = uVar1;
  uStack_600 = uVar2;
  local_5f8 = uVar3;
  uStack_5f0 = uVar4;
  local_5d8 = uVar28;
  uStack_5d0 = uVar29;
  local_578 = uVar30;
  uStack_570 = uVar31;
  local_508 = uVar42;
  uStack_500 = uVar5;
  local_4f8 = uVar32;
  uStack_4f0 = uVar33;
  _local_428 = auVar39;
  local_3b8 = uVar35;
  local_398 = uVar36;
  local_358 = local_368;
  uStack_350 = uStack_360;
  local_338 = local_418;
  uStack_330 = uStack_410;
  local_328 = local_418;
  uStack_320 = uStack_410;
  local_2b8 = local_418;
  uStack_2b0 = uStack_410;
  local_298 = local_418;
  uStack_290 = uStack_410;
  local_278 = local_418;
  uStack_270 = uStack_410;
  uStack_250 = local_388;
  uStack_1b0 = uStack_240;
  local_188 = local_1a8;
  uStack_180 = uStack_1a0;
  local_178 = local_408;
  uStack_170 = uStack_400;
  local_168 = local_368;
  uStack_160 = local_368;
  uStack_120 = uVar37;
  local_d8 = local_418;
  uStack_d0 = uStack_410;
  local_b8 = local_408;
  uStack_b0 = uStack_400;
  local_38 = local_388;
  *local_6f0 = local_468._0_8_ ^ 0x8080808080808080;
  puVar27[1] = uVar41;
  puVar27 = local_3f8;
  local_2c8 = local_458._0_8_;
  uStack_2c0 = local_458._8_8_;
  local_2d8 = local_418;
  uStack_2d0 = uStack_410;
  uVar42 = local_458._8_8_ ^ uStack_410;
  *local_3f8 = local_458._0_8_ ^ local_418;
  puVar27[1] = uVar42;
  local_a48[0] = lStack_b60;
  local_a48[1] = 0;
  local_a38 = lStack_b50;
  lStack_a30 = 0;
  palVar38 = (__m128i *)&local_b68;
  transpose4x8_8x4_sse2
            ((__m128i *)local_a48,palVar38,(__m128i *)&local_b58,(__m128i *)&stack0xfffffffffffff5c8
             ,&local_ad8,&local_ae8,&local_af8,&local_b08,&local_b18,&local_b28,&local_b38,
             &local_b48);
  v[1] = extraout_RDX;
  v[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2),v);
  v_00[1] = extraout_RDX_00;
  v_00[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)local_9e4),v_00);
  v_01[1] = extraout_RDX_01;
  v_01[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 << 1)),v_01);
  v_02[1] = extraout_RDX_02;
  v_02[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 * 3)),v_02);
  v_03[1] = extraout_RDX_03;
  v_03[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 << 2)),v_03);
  v_04[1] = extraout_RDX_04;
  v_04[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 * 5)),v_04);
  v_05[1] = extraout_RDX_05;
  v_05[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 * 6)),v_05);
  v_06[1] = extraout_RDX_06;
  v_06[0] = (longlong)palVar38;
  xx_storel_32((void *)(local_9e0 + -2 + (long)(local_9e4 * 7)),v_06);
  return;
}

Assistant:

void aom_lpf_vertical_4_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0,
                                  const uint8_t *_blimit1,
                                  const uint8_t *_limit1,
                                  const uint8_t *_thresh1) {
  __m128i p0, q0, q1, p1;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i qs1qs0, ps1ps0;

  const __m128i zero = _mm_setzero_si128();
  const __m128i blimit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_blimit0),
                         _mm_load_si128((const __m128i *)_blimit1));
  const __m128i limit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_limit0),
                         _mm_load_si128((const __m128i *)_limit1));

  __m128i l = _mm_unpacklo_epi64(blimit, limit);

  __m128i thresh0 =
      _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)_thresh0), zero);

  __m128i thresh1 =
      _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)_thresh1), zero);

  __m128i t = _mm_unpacklo_epi64(thresh0, thresh1);

  x0 = _mm_loadl_epi64((__m128i *)((s - 2)));
  x1 = _mm_loadl_epi64((__m128i *)((s - 2) + p));
  x2 = _mm_loadl_epi64((__m128i *)((s - 2) + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)((s - 2) + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)((s - 2) + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)((s - 2) + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)((s - 2) + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)((s - 2) + 7 * p));

  transpose8x8_low_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &p1, &p0, &q0,
                        &q1);

  lpf_internal_4_dual_sse2(&p1, &p0, &q0, &q1, &l, &t, &qs1qs0, &ps1ps0);

  p1 = _mm_srli_si128(ps1ps0, 8);
  q1 = _mm_srli_si128(qs1qs0, 8);

  transpose4x8_8x4_sse2(&p1, &ps1ps0, &qs1qs0, &q1, &d0, &d1, &d2, &d3, &d4,
                        &d5, &d6, &d7);

  xx_storel_32((s - 2 + 0 * p), d0);
  xx_storel_32((s - 2 + 1 * p), d1);
  xx_storel_32((s - 2 + 2 * p), d2);
  xx_storel_32((s - 2 + 3 * p), d3);
  xx_storel_32((s - 2 + 4 * p), d4);
  xx_storel_32((s - 2 + 5 * p), d5);
  xx_storel_32((s - 2 + 6 * p), d6);
  xx_storel_32((s - 2 + 7 * p), d7);
}